

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

tuple __thiscall
pybind11::
make_tuple<(pybind11::return_value_policy)1,pybind11::object&,pybind11::str,pybind11::int_>
          (pybind11 *this,object *args_,str *args__1,int_ *args__2)

{
  PyTypeObject *pPVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  handle *this_00;
  cast_error *__return_storage_ptr__;
  reference type;
  PyObject **ppPVar6;
  handle local_150;
  iterator local_148;
  value_type *arg_value;
  iterator __end0;
  iterator __begin0;
  array<pybind11::object,_3UL> *__range2;
  int counter;
  undefined1 *local_100;
  undefined1 local_f8 [8];
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
  argtypes;
  size_t i;
  PyObject *local_88;
  handle local_80;
  PyObject *local_78;
  handle local_60;
  PyObject *local_58;
  pybind11 *local_50;
  undefined1 local_48 [8];
  array<pybind11::object,_3UL> args;
  size_t size;
  int_ *args__local_2;
  str *args__local_1;
  object *args__local;
  tuple *result;
  
  args._M_elems[2].super_handle.m_ptr = (handle)(PyObject *)0x3;
  local_50 = (pybind11 *)local_48;
  handle::handle(&local_60,(PyObject *)0x0);
  local_58 = (PyObject *)
             detail::pyobject_caster<pybind11::object>::cast
                       (&args_->super_handle,automatic_reference,local_60);
  reinterpret_steal<pybind11::object>((pybind11 *)local_48,(handle)local_58);
  local_50 = (pybind11 *)&args;
  handle::handle(&local_80,(PyObject *)0x0);
  local_78 = (PyObject *)
             detail::pyobject_caster<pybind11::str>::cast
                       ((handle *)args__1,automatic_reference,local_80);
  reinterpret_steal<pybind11::object>((pybind11 *)&args,(handle)local_78);
  local_50 = (pybind11 *)(args._M_elems + 1);
  handle::handle((handle *)&i,(PyObject *)0x0);
  local_88 = (PyObject *)
             detail::pyobject_caster<pybind11::int_>::cast
                       ((handle *)args__2,automatic_reference,(handle)i);
  reinterpret_steal<pybind11::object>((pybind11 *)(args._M_elems + 1),(handle)local_88);
  argtypes._M_elems[2].field_2._8_8_ = 0;
  while( true ) {
    uVar2 = argtypes._M_elems[2].field_2._8_8_;
    sVar5 = std::array<pybind11::object,_3UL>::size((array<pybind11::object,_3UL> *)local_48);
    if (sVar5 <= (ulong)uVar2) {
      __range2._6_1_ = 0;
      tuple::tuple<unsigned_long,_0>((tuple *)this,3);
      __range2._0_4_ = 0;
      __begin0 = (iterator)local_48;
      __end0 = std::array<pybind11::object,_3UL>::begin((array<pybind11::object,_3UL> *)__begin0);
      arg_value = std::array<pybind11::object,_3UL>::end((array<pybind11::object,_3UL> *)__begin0);
      while( true ) {
        if (__end0 == arg_value) {
          __range2._6_1_ = 1;
          std::array<pybind11::object,_3UL>::~array((array<pybind11::object,_3UL> *)local_48);
          return (object)(object)this;
        }
        local_148 = __end0;
        local_150 = object::release(__end0);
        ppPVar6 = handle::ptr(&local_150);
        pPVar1 = (PyTypeObject *)*ppPVar6;
        ppPVar6 = handle::ptr((handle *)this);
        iVar4 = ::PyType_HasFeature((*ppPVar6)->ob_type,0x4000000);
        if (iVar4 == 0) break;
        ppPVar6 = handle::ptr((handle *)this);
        (&(*ppPVar6)[1].ob_type)[(int)__range2] = pPVar1;
        __end0 = __end0 + 1;
        __range2._0_4_ = (int)__range2 + 1;
      }
      __assert_fail("PyTuple_Check(result.ptr())",
                    "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/pybind11/include/pybind11/cast.h"
                    ,0x40b,
                    "tuple pybind11::make_tuple(Args &&...) [policy = pybind11::return_value_policy::automatic_reference, Args = <pybind11::object &, pybind11::str, pybind11::int_>]"
                   );
    }
    this_00 = &std::array<pybind11::object,_3UL>::operator[]
                         ((array<pybind11::object,_3UL> *)local_48,
                          argtypes._M_elems[2].field_2._8_8_)->super_handle;
    bVar3 = handle::operator_cast_to_bool(this_00);
    if (!bVar3) break;
    argtypes._M_elems[2].field_2._8_8_ = argtypes._M_elems[2].field_2._8_8_ + 1;
  }
  local_100 = local_f8;
  type_id<pybind11::object&>();
  local_100 = (undefined1 *)((long)&argtypes._M_elems[0].field_2 + 8);
  type_id<pybind11::str>();
  local_100 = (undefined1 *)((long)&argtypes._M_elems[1].field_2 + 8);
  type_id<pybind11::int_>();
  __range2._7_1_ = 1;
  __return_storage_ptr__ = (cast_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string((string *)&counter,argtypes._M_elems[2].field_2._8_8_);
  type = std::
         array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
         ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                       *)local_f8,argtypes._M_elems[2].field_2._8_8_);
  cast_error_unable_to_convert_call_arg(__return_storage_ptr__,(string *)&counter,type);
  __range2._7_1_ = 0;
  __cxa_throw(__return_storage_ptr__,&cast_error::typeinfo,cast_error::~cast_error);
}

Assistant:

tuple make_tuple(Args&&... args_) {
    constexpr size_t size = sizeof...(Args);
    std::array<object, size> args {
        { reinterpret_steal<object>(detail::make_caster<Args>::cast(
            std::forward<Args>(args_), policy, nullptr))... }
    };
    for (size_t i = 0; i < args.size(); i++) {
        if (!args[i]) {
#if defined(NDEBUG)
            throw cast_error_unable_to_convert_call_arg();
#else
            std::array<std::string, size> argtypes { {type_id<Args>()...} };
            throw cast_error_unable_to_convert_call_arg(std::to_string(i), argtypes[i]);
#endif
        }
    }
    tuple result(size);
    int counter = 0;
    for (auto &arg_value : args)
        PyTuple_SET_ITEM(result.ptr(), counter++, arg_value.release().ptr());
    return result;
}